

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3EvalTokenCosts(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3Expr *pExpr,Fts3TokenAndCost **ppTC,
                       Fts3Expr ***ppOr,int *pRc)

{
  int iVar1;
  Fts3Table *p;
  Fts3SegReader *pFVar2;
  int iVar3;
  Fts3MultiSegReader *pFVar4;
  Fts3Expr ***pnLoad;
  long lVar5;
  int iVar6;
  sqlite3_int64 iBlockid;
  int local_7c;
  Fts3MultiSegReader *local_78;
  Fts3PhraseToken *local_70;
  Fts3Phrase *local_68;
  Fts3Expr *local_60;
  Fts3Cursor *local_58;
  Fts3TokenAndCost **local_50;
  int *local_48;
  Fts3TokenAndCost *local_40;
  long local_38;
  
  pnLoad = ppOr;
  do {
    if (*pRc != 0) {
      return;
    }
    iVar3 = pExpr->eType;
    if (iVar3 == 4) {
      pRoot = pExpr->pLeft;
      **ppOr = pRoot;
      *ppOr = *ppOr + 1;
    }
    else {
      if (iVar3 == 2) {
        return;
      }
      if (iVar3 == 5) {
        local_68 = pExpr->pPhrase;
        local_70 = local_68->aToken;
        local_38 = 0;
        iVar3 = 0;
        local_60 = pRoot;
        local_58 = pCsr;
        local_50 = ppTC;
        local_48 = pRc;
        do {
          if ((iVar3 != 0) || (local_68->nToken <= local_38)) {
            return;
          }
          local_40 = *local_50;
          *local_50 = local_40 + 1;
          local_40->pPhrase = local_68;
          local_40->iToken = (int)local_38;
          local_40->pRoot = local_60;
          local_40->pToken = local_70 + local_38;
          local_40->iCol = local_68->iColumn;
          pFVar4 = local_70[local_38].pSegcsr;
          p = (Fts3Table *)(local_58->base).pVtab;
          iVar1 = p->nPgsz;
          iVar3 = 0;
          iVar6 = 0;
          local_78 = pFVar4;
          for (lVar5 = 0; (iVar3 == 0 && (lVar5 < pFVar4->nSegment)); lVar5 = lVar5 + 1) {
            pFVar2 = pFVar4->apSegment[lVar5];
            iVar3 = 0;
            if ((pFVar2->ppNextElem == (Fts3HashElem **)0x0) && (pFVar2->rootOnly == '\0')) {
              for (iBlockid = pFVar2->iStartBlock; iBlockid <= pFVar2->iLeafEndBlock;
                  iBlockid = iBlockid + 1) {
                iVar3 = sqlite3Fts3ReadBlock(p,iBlockid,(char **)0x0,&local_7c,(int *)pnLoad);
                pFVar4 = local_78;
                if (iVar3 != 0) goto LAB_001a60a0;
                if (iVar1 < local_7c + 0x23) {
                  iVar6 = iVar6 + (local_7c + 0x22) / iVar1;
                }
              }
              iVar3 = 0;
              pFVar4 = local_78;
            }
LAB_001a60a0:
          }
          local_40->nOvfl = iVar6;
          *local_48 = iVar3;
          local_38 = local_38 + 1;
        } while( true );
      }
    }
    pnLoad = ppOr;
    fts3EvalTokenCosts(pCsr,pRoot,pExpr->pLeft,ppTC,ppOr,pRc);
    if (pExpr->eType == 4) {
      pRoot = pExpr->pRight;
      **ppOr = pRoot;
      *ppOr = *ppOr + 1;
    }
    pExpr = pExpr->pRight;
  } while( true );
}

Assistant:

static void fts3EvalTokenCosts(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Root of current AND/NEAR cluster */
  Fts3Expr *pExpr,                /* Expression to consider */
  Fts3TokenAndCost **ppTC,        /* Write new entries to *(*ppTC)++ */
  Fts3Expr ***ppOr,               /* Write new OR root to *(*ppOr)++ */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      Fts3Phrase *pPhrase = pExpr->pPhrase;
      int i;
      for(i=0; *pRc==SQLITE_OK && i<pPhrase->nToken; i++){
        Fts3TokenAndCost *pTC = (*ppTC)++;
        pTC->pPhrase = pPhrase;
        pTC->iToken = i;
        pTC->pRoot = pRoot;
        pTC->pToken = &pPhrase->aToken[i];
        pTC->iCol = pPhrase->iColumn;
        *pRc = sqlite3Fts3MsrOvfl(pCsr, pTC->pToken->pSegcsr, &pTC->nOvfl);
      }
    }else if( pExpr->eType!=FTSQUERY_NOT ){
      assert( pExpr->eType==FTSQUERY_OR
           || pExpr->eType==FTSQUERY_AND
           || pExpr->eType==FTSQUERY_NEAR
      );
      assert( pExpr->pLeft && pExpr->pRight );
      if( pExpr->eType==FTSQUERY_OR ){
        pRoot = pExpr->pLeft;
        **ppOr = pRoot;
        (*ppOr)++;
      }
      fts3EvalTokenCosts(pCsr, pRoot, pExpr->pLeft, ppTC, ppOr, pRc);
      if( pExpr->eType==FTSQUERY_OR ){
        pRoot = pExpr->pRight;
        **ppOr = pRoot;
        (*ppOr)++;
      }
      fts3EvalTokenCosts(pCsr, pRoot, pExpr->pRight, ppTC, ppOr, pRc);
    }
  }
}